

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_expr.hpp
# Opt level: O2

rt_expression_interface<double> * __thiscall
viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::substitute
          (rt_unary_expr<viennamath::rt_expression_interface<double>_> *this,
          vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
          *e,vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
             *repl)

{
  int iVar1;
  int iVar2;
  rt_expression_interface<double> *prVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  rt_expression_interface<double> *prVar4;
  ulong uVar5;
  
  uVar5 = 0;
  while( true ) {
    if ((ulong)(*(long *)(e + 8) - *(long *)e >> 3) <= uVar5) {
      prVar3 = (rt_expression_interface<double> *)operator_new(0x18);
      prVar4 = (this->expr_)._M_ptr;
      iVar1 = (*prVar4->_vptr_rt_expression_interface[0xf])(prVar4,e,repl);
      iVar2 = (*((this->op_)._M_ptr)->_vptr_op_interface[2])();
      prVar3->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_unary_expr_001117e0;
      prVar3[1]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var,iVar1);
      prVar3[2]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var_00,iVar2);
      return prVar3;
    }
    iVar1 = (*(this->super_rt_expression_interface<double>)._vptr_rt_expression_interface[0xb])
                      (this,*(undefined8 *)(*(long *)e + uVar5 * 8));
    if ((char)iVar1 != '\0') break;
    uVar5 = uVar5 + 1;
  }
  prVar4 = (rt_expression_interface<double> *)
           (**(code **)(**(long **)(*(long *)repl + uVar5 * 8) + 0x10))();
  return prVar4;
}

Assistant:

InterfaceType * substitute(std::vector<const InterfaceType *> const &  e,
                                 std::vector<const InterfaceType *> const &  repl) const
      {
        for (std::size_t i=0; i<e.size(); ++i)
          if (deep_equal(e[i]))
            return repl[i]->clone();

        return new rt_unary_expr(expr_->substitute(e, repl),
                              op_->clone());
      }